

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O0

void __thiscall
QPDF::EncryptionData::setV5EncryptionParameters
          (EncryptionData *this,string *O,string *OE,string *U,string *UE,string *Perms)

{
  string *Perms_local;
  string *UE_local;
  string *U_local;
  string *OE_local;
  string *O_local;
  EncryptionData *this_local;
  
  std::__cxx11::string::operator=((string *)&this->O,(string *)O);
  std::__cxx11::string::operator=((string *)&this->OE,(string *)OE);
  std::__cxx11::string::operator=((string *)&this->U,(string *)U);
  std::__cxx11::string::operator=((string *)&this->UE,(string *)UE);
  std::__cxx11::string::operator=((string *)&this->Perms,(string *)Perms);
  return;
}

Assistant:

void
QPDF::EncryptionData::setV5EncryptionParameters(
    std::string const& O,
    std::string const& OE,
    std::string const& U,
    std::string const& UE,
    std::string const& Perms)
{
    this->O = O;
    this->OE = OE;
    this->U = U;
    this->UE = UE;
    this->Perms = Perms;
}